

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void strftimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uchar uVar1;
  int iVar2;
  uchar *puVar3;
  char c;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  sqlite3_str sRes;
  DateTime x;
  DateTime y;
  sqlite3_str local_58;
  
  if (((argc == 0) || (puVar3 = sqlite3_value_text(*argv), puVar3 == (uchar *)0x0)) ||
     (iVar2 = isDate(context,argc + -1,argv + 1,&x), iVar2 != 0)) {
    return;
  }
  local_58.mxAlloc = context->pOut->db->aLimit[0];
  local_58.db = (sqlite3 *)0x0;
  local_58.zText = (char *)0x0;
  local_58.nAlloc = 0;
  local_58.nChar = 0;
  local_58.accError = '\0';
  local_58.printfFlags = '\0';
  computeJD(&x);
  computeYMD_HMS(&x);
  uVar6 = 0;
  uVar7 = 0;
  do {
    if (puVar3[uVar7] == '%') {
      if (uVar6 < uVar7) {
        sqlite3_str_append(&local_58,(char *)(puVar3 + uVar6),(int)uVar7 - (int)uVar6);
      }
      uVar4 = uVar7 + 1;
      uVar1 = puVar3[uVar7 + 1];
      uVar6 = uVar7 + 2;
      uVar7 = uVar4;
      switch(uVar1) {
      case 'd':
        uVar4 = (ulong)(uint)x.D;
        break;
      case 'e':
      case 'g':
      case 'h':
      case 'i':
      case 'k':
      case 'l':
switchD_0019777c_caseD_65:
        sqlite3_str_reset(&local_58);
        return;
      case 'f':
        dVar8 = 59.999;
        if (x.s <= 59.999) {
          dVar8 = x.s;
        }
        pcVar5 = "%06.3f";
        goto LAB_001978bd;
      case 'j':
switchD_0019777c_caseD_6a:
        y.s = x.s;
        y.iJD = x.iJD;
        y._40_8_ = CONCAT17(x.useSubsec,x._40_7_) & 0xffffffffffffff00;
        y.M = 1;
        y.Y = x.Y;
        y.h = x.h;
        y.D = 1;
        computeJD(&y);
        iVar2 = (int)(((x.iJD + 43200000) - y.iJD) / 86400000);
        if (uVar1 == 'W') {
          pcVar5 = "%02d";
          uVar4 = (long)((iVar2 - (int)(((x.iJD + 43200000) / 86400000) % 7)) + 7) / 7 & 0xffffffff;
        }
        else {
          pcVar5 = "%03d";
          uVar4 = (ulong)(iVar2 + 1);
        }
        goto LAB_001978e6;
      case 'm':
        uVar4 = (ulong)(uint)x.M;
        break;
      default:
        if (uVar1 == '%') {
          c = '%';
LAB_001978cf:
          sqlite3_str_appendchar(&local_58,1,c);
          goto LAB_001978f0;
        }
        if (uVar1 == 'H') {
          uVar4 = (ulong)(uint)x.h;
        }
        else {
          if (uVar1 == 'J') {
            dVar8 = (double)x.iJD / 86400000.0;
            pcVar5 = "%.16g";
LAB_001978bd:
            sqlite3_str_appendf(&local_58,pcVar5,dVar8);
            goto LAB_001978f0;
          }
          if (uVar1 == 'M') {
            uVar4 = (ulong)(uint)x.m;
          }
          else {
            if (uVar1 != 'S') {
              if (uVar1 == 'W') goto switchD_0019777c_caseD_6a;
              if (uVar1 == 'Y') {
                uVar4 = (ulong)(uint)x.Y;
                pcVar5 = "%04d";
                goto LAB_001978e6;
              }
              if (uVar1 != 's') {
                if (uVar1 != 'w') goto switchD_0019777c_caseD_65;
                c = (char)(((x.iJD + 0x7b98a00) / 86400000) % 7) + '0';
                goto LAB_001978cf;
              }
              if (x.useSubsec == '\0') {
                sqlite3_str_appendf(&local_58,"%lld",x.iJD / 1000 + -0x3118a36940);
                goto LAB_001978f0;
              }
              dVar8 = (double)(x.iJD + -0xbfc83e532200) / 1000.0;
              pcVar5 = "%.3f";
              goto LAB_001978bd;
            }
            uVar4 = (ulong)(uint)(int)x.s;
          }
        }
      }
      pcVar5 = "%02d";
LAB_001978e6:
      sqlite3_str_appendf(&local_58,pcVar5,uVar4);
    }
    else if (puVar3[uVar7] == '\0') {
      if (uVar6 < uVar7) {
        sqlite3_str_append(&local_58,(char *)(puVar3 + uVar6),(int)uVar7 - (int)uVar6);
      }
      sqlite3ResultStrAccum(context,&local_58);
      return;
    }
LAB_001978f0:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static void strftimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  size_t i,j;
  sqlite3 *db;
  const char *zFmt;
  sqlite3_str sRes;


  if( argc==0 ) return;
  zFmt = (const char*)sqlite3_value_text(argv[0]);
  if( zFmt==0 || isDate(context, argc-1, argv+1, &x) ) return;
  db = sqlite3_context_db_handle(context);
  sqlite3StrAccumInit(&sRes, 0, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);

  computeJD(&x);
  computeYMD_HMS(&x);
  for(i=j=0; zFmt[i]; i++){
    if( zFmt[i]!='%' ) continue;
    if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
    i++;
    j = i + 1;
    switch( zFmt[i] ){
      case 'd': {
        sqlite3_str_appendf(&sRes, "%02d", x.D);
        break;
      }
      case 'f': {
        double s = x.s;
        if( s>59.999 ) s = 59.999;
        sqlite3_str_appendf(&sRes, "%06.3f", s);
        break;
      }
      case 'H': {
        sqlite3_str_appendf(&sRes, "%02d", x.h);
        break;
      }
      case 'W': /* Fall thru */
      case 'j': {
        int nDay;             /* Number of days since 1st day of year */
        DateTime y = x;
        y.validJD = 0;
        y.M = 1;
        y.D = 1;
        computeJD(&y);
        nDay = (int)((x.iJD-y.iJD+43200000)/86400000);
        if( zFmt[i]=='W' ){
          int wd;   /* 0=Monday, 1=Tuesday, ... 6=Sunday */
          wd = (int)(((x.iJD+43200000)/86400000)%7);
          sqlite3_str_appendf(&sRes,"%02d",(nDay+7-wd)/7);
        }else{
          sqlite3_str_appendf(&sRes,"%03d",nDay+1);
        }
        break;
      }
      case 'J': {
        sqlite3_str_appendf(&sRes,"%.16g",x.iJD/86400000.0);
        break;
      }
      case 'm': {
        sqlite3_str_appendf(&sRes,"%02d",x.M);
        break;
      }
      case 'M': {
        sqlite3_str_appendf(&sRes,"%02d",x.m);
        break;
      }
      case 's': {
        if( x.useSubsec ){
          sqlite3_str_appendf(&sRes,"%.3f",
                (x.iJD - 21086676*(i64)10000000)/1000.0);
        }else{
          i64 iS = (i64)(x.iJD/1000 - 21086676*(i64)10000);
          sqlite3_str_appendf(&sRes,"%lld",iS);
        }
        break;
      }
      case 'S': {
        sqlite3_str_appendf(&sRes,"%02d",(int)x.s);
        break;
      }
      case 'w': {
        sqlite3_str_appendchar(&sRes, 1,
                       (char)(((x.iJD+129600000)/86400000) % 7) + '0');
        break;
      }
      case 'Y': {
        sqlite3_str_appendf(&sRes,"%04d",x.Y);
        break;
      }
      case '%': {
        sqlite3_str_appendchar(&sRes, 1, '%');
        break;
      }
      default: {
        sqlite3_str_reset(&sRes);
        return;
      }
    }
  }
  if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
  sqlite3ResultStrAccum(context, &sRes);
}